

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QColorDialogPrivate::initWidgets(QColorDialogPrivate *this)

{
  QWidget *parent;
  QWellArray *pQVar1;
  QColorPicker *pQVar2;
  void **ppvVar3;
  QColorShower *pQVar4;
  QVBoxLayout *this_00;
  bool bVar5;
  char cVar6;
  int iVar7;
  QLayout *this_01;
  QLayout *pQVar8;
  int extraout_var;
  QColorWell *pQVar9;
  QRgb *pQVar10;
  QLabel *pQVar11;
  long *plVar12;
  QLayout *pQVar13;
  QLayout *layout;
  QColorPicker *this_02;
  QColorLuminancePicker *pQVar14;
  undefined4 *puVar15;
  QColorShower *this_03;
  QWidget *pQVar16;
  QPushButton *pQVar17;
  int extraout_EDX;
  int extraout_var_00;
  long in_FS_OFFSET;
  QMargins QVar18;
  QByteArrayView QVar19;
  QObject local_d0 [8];
  QObject local_c8 [8];
  QObject local_c0 [8];
  Connection local_b8;
  QObject local_b0 [8];
  Connection local_a8;
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  Connection local_88;
  QObject local_80 [8];
  QString local_78;
  QObject local_60 [8];
  undefined1 local_58 [16];
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_01,parent);
  QLayout::setSizeConstraint(this_01,SetFixedSize);
  pQVar8 = (QLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)pQVar8);
  QBoxLayout::addLayout((QBoxLayout *)this_01,pQVar8,0);
  this->leftLay = (QVBoxLayout *)0x0;
  QGuiApplication::primaryScreen();
  iVar7 = QScreen::virtualGeometry();
  bVar5 = true;
  if (0x1df < (extraout_EDX - iVar7) + 1) {
    QGuiApplication::primaryScreen();
    QScreen::virtualGeometry();
    bVar5 = (extraout_var_00 - extraout_var) + 1 < 0x15e;
  }
  this->smallDisplay = bVar5;
  iVar7 = (**(code **)(*(long *)pQVar8 + 0x60))(pQVar8);
  if (this->smallDisplay != false) {
    pWidth = 1;
    pHeight = 1;
    this->custom = (QWellArray *)0x0;
    this->standard = (QWellArray *)0x0;
    goto LAB_004dd31e;
  }
  pQVar13 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)pQVar13);
  this->leftLay = (QVBoxLayout *)pQVar13;
  QBoxLayout::addLayout((QBoxLayout *)pQVar8,pQVar13,0);
  pQVar9 = (QColorWell *)operator_new(0x68);
  pQVar10 = (QRgb *)QColorDialogOptions::standardColors();
  QtPrivate::QColorWell::QColorWell(pQVar9,parent,6,8,pQVar10);
  this->standard = (QWellArray *)pQVar9;
  pQVar11 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar11,parent,(WindowFlags)0x0);
  this->lblBasicColors = pQVar11;
  QLabel::setBuddy(pQVar11,&this->standard->super_QWidget);
  pQVar1 = this->standard;
  local_58 = ZEXT816(0x4d7fd0);
  local_78.d.d = (Data *)newStandard;
  local_78.d.ptr = (char16_t *)0x0;
  ppvVar3 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QColorDialogPrivate::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(code **)(puVar15 + 4) = newStandard;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar1,(QObject *)local_58,ppvVar3,(QSlotObjectBase *)&local_78,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QBoxLayout::addWidget
            (&this->leftLay->super_QBoxLayout,(QWidget *)this->lblBasicColors,0,(Alignment)0x0);
  QBoxLayout::addWidget
            (&this->leftLay->super_QBoxLayout,&this->standard->super_QWidget,0,(Alignment)0x0);
  plVar12 = QGuiApplicationPrivate::platform_integration;
  cVar6 = (**(code **)(*QGuiApplicationPrivate::platform_integration + 0x10))
                    (QGuiApplicationPrivate::platform_integration);
  if (cVar6 == '\0') {
    plVar12 = (long *)(**(code **)(*plVar12 + 0x98))(plVar12);
    cVar6 = (**(code **)(*plVar12 + 0x28))(plVar12);
    if (cVar6 != '\0') goto LAB_004dce84;
    this->eyeDropperButton = (QPushButton *)0x0;
    this->lblScreenColorInfo = (QLabel *)0x0;
  }
  else {
LAB_004dce84:
    pQVar16 = (QWidget *)operator_new(0x28);
    QPushButton::QPushButton((QPushButton *)pQVar16,(QWidget *)0x0);
    this->eyeDropperButton = (QPushButton *)pQVar16;
    QBoxLayout::addWidget(&this->leftLay->super_QBoxLayout,pQVar16,0,(Alignment)0x0);
    pQVar11 = (QLabel *)operator_new(0x28);
    QVar19.m_data = (storage_type *)0x1;
    QVar19.m_size = (qsizetype)local_58;
    QString::fromLatin1(QVar19);
    local_78.d.d = (Data *)local_58._0_8_;
    local_78.d.ptr = (char16_t *)local_58._8_8_;
    local_78.d.size = local_48;
    QLabel::QLabel(pQVar11,&local_78,(QWidget *)0x0,(WindowFlags)0x0);
    this->lblScreenColorInfo = pQVar11;
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    QBoxLayout::addWidget
              (&this->leftLay->super_QBoxLayout,(QWidget *)this->lblScreenColorInfo,0,(Alignment)0x0
              );
    pQVar17 = this->eyeDropperButton;
    local_58._8_8_ = 0;
    local_58._0_8_ = QAbstractButton::clicked;
    local_78.d.d = (Data *)pickScreenColor;
    local_78.d.ptr = (char16_t *)0x0;
    ppvVar3 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    puVar15 = (undefined4 *)operator_new(0x20);
    *puVar15 = 1;
    *(code **)(puVar15 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QColorDialogPrivate::*)(),_QtPrivate::List<>,_void>::
         impl;
    *(code **)(puVar15 + 4) = pickScreenColor;
    *(undefined8 *)(puVar15 + 6) = 0;
    QObject::connectImpl
              (local_80,(void **)pQVar17,(QObject *)local_58,ppvVar3,(QSlotObjectBase *)&local_78,
               (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_80);
  }
  QBoxLayout::addStretch(&this->leftLay->super_QBoxLayout,0);
  pQVar9 = (QColorWell *)operator_new(0x68);
  pQVar10 = (QRgb *)QColorDialogOptions::customColors();
  QtPrivate::QColorWell::QColorWell(pQVar9,parent,2,8,pQVar10);
  this->custom = (QWellArray *)pQVar9;
  QWidget::setAcceptDrops((QWidget *)pQVar9,true);
  pQVar1 = this->custom;
  local_58 = ZEXT816(0x4d7fd0);
  local_78.d.d = (Data *)newCustom;
  local_78.d.ptr = (char16_t *)0x0;
  ppvVar3 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QColorDialogPrivate::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(code **)(puVar15 + 4) = newCustom;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_88,(void **)pQVar1,(QObject *)local_58,ppvVar3,
             (QSlotObjectBase *)&local_78,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_88);
  pQVar1 = this->custom;
  local_58 = ZEXT816(0x4d7e4e);
  local_78.d.d = (Data *)nextCustom;
  local_78.d.ptr = (char16_t *)0x0;
  ppvVar3 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QColorDialogPrivate::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(code **)(puVar15 + 4) = nextCustom;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_90,(void **)pQVar1,(QObject *)local_58,ppvVar3,(QSlotObjectBase *)&local_78,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  pQVar1 = this->custom;
  local_58 = ZEXT816(0x4d8b46);
  puVar15 = (undefined4 *)operator_new(0x18);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/dialogs/qcolordialog.cpp:1768:64),_QtPrivate::List<int,_unsigned_int>,_void>
       ::impl;
  *(QColorDialogPrivate **)(puVar15 + 4) = this;
  QObject::connectImpl
            (local_98,(void **)pQVar1,(QObject *)local_58,(void **)parent,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  pQVar11 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar11,parent,(WindowFlags)0x0);
  this->lblCustomColors = pQVar11;
  QLabel::setBuddy(pQVar11,&this->custom->super_QWidget);
  QBoxLayout::addWidget
            (&this->leftLay->super_QBoxLayout,(QWidget *)this->lblCustomColors,0,(Alignment)0x0);
  QBoxLayout::addWidget
            (&this->leftLay->super_QBoxLayout,&this->custom->super_QWidget,0,(Alignment)0x0);
  pQVar17 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar17,parent);
  this->addCusBt = pQVar17;
  local_58._8_8_ = 0;
  local_58._0_8_ = QAbstractButton::clicked;
  local_78.d.d = (Data *)addCustom;
  local_78.d.ptr = (char16_t *)0x0;
  ppvVar3 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QColorDialogPrivate::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar15 + 4) = addCustom;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_a0,(void **)pQVar17,(QObject *)local_58,ppvVar3,(QSlotObjectBase *)&local_78,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QBoxLayout::addWidget(&this->leftLay->super_QBoxLayout,(QWidget *)this->addCusBt,0,(Alignment)0x0)
  ;
LAB_004dd31e:
  pQVar13 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)pQVar13);
  QBoxLayout::addLayout((QBoxLayout *)pQVar8,pQVar13,0);
  pQVar8 = (QLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)pQVar8);
  QBoxLayout::addLayout((QBoxLayout *)pQVar13,pQVar8,0);
  layout = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)layout);
  QBoxLayout::addLayout((QBoxLayout *)pQVar8,layout,0);
  this_02 = (QColorPicker *)operator_new(0x50);
  QtPrivate::QColorPicker::QColorPicker(this_02,parent);
  this->cp = this_02;
  QFrame::setFrameStyle((QFrame *)this_02,0x32);
  QBoxLayout::addSpacing((QBoxLayout *)layout,iVar7 / 2);
  QBoxLayout::addWidget((QBoxLayout *)layout,(QWidget *)this->cp,0,(Alignment)0x0);
  QBoxLayout::addSpacing((QBoxLayout *)layout,iVar7 / 2);
  pQVar14 = (QColorLuminancePicker *)operator_new(0x40);
  QWidget::QWidget((QWidget *)pQVar14,parent,(WindowFlags)0x0);
  *(undefined ***)&pQVar14->super_QWidget = &PTR_metaObject_0080da98;
  *(undefined ***)&(pQVar14->super_QWidget).super_QPaintDevice =
       &PTR__QColorLuminancePicker_0080dc48;
  pQVar14->val = 100;
  pQVar14->hue = 100;
  pQVar14->sat = 100;
  pQVar14->pix = (QPixmap *)0x0;
  this->lp = pQVar14;
  QWidget::setFixedWidth((QWidget *)pQVar14,0x14);
  QBoxLayout::addSpacing((QBoxLayout *)pQVar8,10);
  QBoxLayout::addWidget((QBoxLayout *)pQVar8,&this->lp->super_QWidget,0,(Alignment)0x0);
  QBoxLayout::addStretch((QBoxLayout *)pQVar8,0);
  pQVar2 = this->cp;
  pQVar14 = this->lp;
  local_78.d.d = (Data *)QtPrivate::QColorLuminancePicker::setCol;
  local_78.d.ptr = (char16_t *)0x0;
  local_58 = ZEXT816(0x4d9a68);
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QCallableObject<void_(QtPrivate::QColorLuminancePicker::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(code **)(puVar15 + 4) = QtPrivate::QColorLuminancePicker::setCol;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_a8,(void **)pQVar2,(QObject *)local_58,(void **)pQVar14,
             (QSlotObjectBase *)&local_78,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_a8);
  pQVar14 = this->lp;
  local_58 = ZEXT816(0x4d8ee6);
  local_78.d.d = (Data *)newHsv;
  local_78.d.ptr = (char16_t *)0x0;
  ppvVar3 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QColorDialogPrivate::*)(int,_int,_int),_QtPrivate::List<int,_int,_int>,_void>
       ::impl;
  *(code **)(puVar15 + 4) = newHsv;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_b0,(void **)pQVar14,(QObject *)local_58,ppvVar3,(QSlotObjectBase *)&local_78,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  QBoxLayout::addStretch((QBoxLayout *)pQVar13,0);
  this_03 = (QColorShower *)operator_new(0xe8);
  QtPrivate::QColorShower::QColorShower(this_03,(QColorDialog *)parent);
  this->cs = this_03;
  local_58 = (undefined1  [16])QLayout::contentsMargins(&this_03->gl->super_QLayout);
  QLayout::setContentsMargins(pQVar8,(QMargins *)local_58);
  pQVar4 = this->cs;
  local_58 = ZEXT816(0x4db368);
  local_78.d.d = (Data *)newColorTypedIn;
  local_78.d.ptr = (char16_t *)0x0;
  ppvVar3 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QColorDialogPrivate::*)(unsigned_int),_QtPrivate::List<unsigned_int>,_void>
       ::impl;
  *(code **)(puVar15 + 4) = newColorTypedIn;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_b8,(void **)pQVar4,(QObject *)local_58,ppvVar3,
             (QSlotObjectBase *)&local_78,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_b8);
  pQVar4 = this->cs;
  local_78.d.d = (Data *)QColorDialog::currentColorChanged;
  local_78.d.ptr = (char16_t *)0x0;
  local_58 = ZEXT816(0x4dc06c);
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QCallableObject<void_(QColorDialog::*)(const_QColor_&),_QtPrivate::List<const_QColor_&>,_void>
       ::impl;
  *(code **)(puVar15 + 4) = QColorDialog::currentColorChanged;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_c0,(void **)pQVar4,(QObject *)local_58,(void **)parent,
             (QSlotObjectBase *)&local_78,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  QBoxLayout::addWidget((QBoxLayout *)pQVar13,&this->cs->super_QWidget,0,(Alignment)0x0);
  this_00 = this->leftLay;
  if (this_00 != (QVBoxLayout *)0x0) {
    QVar18 = QLayout::contentsMargins(&this->cs->gl->super_QLayout);
    QBoxLayout::addSpacing(&this_00->super_QBoxLayout,QVar18.m_right.m_i.m_i);
  }
  pQVar16 = (QWidget *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox((QDialogButtonBox *)pQVar16,parent);
  this->buttons = (QDialogButtonBox *)pQVar16;
  QBoxLayout::addWidget((QBoxLayout *)this_01,pQVar16,0,(Alignment)0x0);
  pQVar17 = QDialogButtonBox::addButton((QDialogButtonBox *)this->buttons,FirstButton);
  this->ok = pQVar17;
  local_78.d.d = (Data *)0x1b9;
  local_78.d.ptr = (char16_t *)0x0;
  local_58._8_8_ = 0;
  local_58._0_8_ = QAbstractButton::clicked;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QCallableObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar15 + 4) = 0x1b9;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_c8,(void **)pQVar17,(QObject *)local_58,(void **)parent,
             (QSlotObjectBase *)&local_78,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  QPushButton::setDefault(this->ok,true);
  pQVar17 = QDialogButtonBox::addButton((QDialogButtonBox *)this->buttons,Cancel);
  this->cancel = pQVar17;
  local_78.d.d = (Data *)0x1c1;
  local_78.d.ptr = (char16_t *)0x0;
  local_58._8_8_ = 0;
  local_58._0_8_ = QAbstractButton::clicked;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QCallableObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar15 + 4) = 0x1c1;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_d0,(void **)pQVar17,(QObject *)local_58,(void **)parent,
             (QSlotObjectBase *)&local_78,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  retranslateStrings(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::initWidgets()
{
    Q_Q(QColorDialog);
    QVBoxLayout *mainLay = new QVBoxLayout(q);
    // there's nothing in this dialog that benefits from sizing up
    mainLay->setSizeConstraint(QLayout::SetFixedSize);

    QHBoxLayout *topLay = new QHBoxLayout();
    mainLay->addLayout(topLay);

    leftLay = nullptr;

#if defined(QT_SMALL_COLORDIALOG)
    smallDisplay = true;
    const int lumSpace = 20;
#else
    // small displays (e.g. PDAs) cannot fit the full color dialog,
    // so just use the color picker.
    smallDisplay = (QGuiApplication::primaryScreen()->virtualGeometry().width() < 480 || QGuiApplication::primaryScreen()->virtualGeometry().height() < 350);
    const int lumSpace = topLay->spacing() / 2;
#endif

    if (!smallDisplay) {
        leftLay = new QVBoxLayout;
        topLay->addLayout(leftLay);

        standard = new QColorWell(q, standardColorRows, colorColumns, QColorDialogOptions::standardColors());
        lblBasicColors = new QLabel(q);
#ifndef QT_NO_SHORTCUT
        lblBasicColors->setBuddy(standard);
#endif
        QObjectPrivate::connect(standard, &QColorWell::selected,
                                this, &QColorDialogPrivate::newStandard);
        leftLay->addWidget(lblBasicColors);
        leftLay->addWidget(standard);

#if !defined(QT_SMALL_COLORDIALOG)
        if (supportsColorPicking()) {
            eyeDropperButton = new QPushButton();
            leftLay->addWidget(eyeDropperButton);
            lblScreenColorInfo = new QLabel("\n"_L1);
            leftLay->addWidget(lblScreenColorInfo);
            QObjectPrivate::connect(eyeDropperButton, &QPushButton::clicked,
                                    this, &QColorDialogPrivate::pickScreenColor);
        } else {
            eyeDropperButton = nullptr;
            lblScreenColorInfo = nullptr;
        }
#endif

        leftLay->addStretch();

        custom = new QColorWell(q, customColorRows, colorColumns, QColorDialogOptions::customColors());
        custom->setAcceptDrops(true);

        QObjectPrivate::connect(custom, &QColorWell::selected, this, &QColorDialogPrivate::newCustom);
        QObjectPrivate::connect(custom, &QColorWell::currentChanged, this, &QColorDialogPrivate::nextCustom);

        QObject::connect(custom, &QWellArray::colorChanged, q, [this] (int index, QRgb color) {
            QColorDialogOptions::setCustomColor(index, color);
            if (custom)
                custom->update();
        });

        lblCustomColors = new QLabel(q);
#ifndef QT_NO_SHORTCUT
        lblCustomColors->setBuddy(custom);
#endif
        leftLay->addWidget(lblCustomColors);
        leftLay->addWidget(custom);

        addCusBt = new QPushButton(q);
        QObjectPrivate::connect(addCusBt, &QPushButton::clicked, this, &QColorDialogPrivate::addCustom);
        leftLay->addWidget(addCusBt);
    } else {
        // better color picker size for small displays
#if defined(QT_SMALL_COLORDIALOG)
        QSize screenSize = QGuiApplication::screenAt(QCursor::pos())->availableGeometry().size();
        pWidth = pHeight = qMin(screenSize.width(), screenSize.height());
        pHeight -= 20;
        if (screenSize.height() > screenSize.width())
            pWidth -= 20;
#else
        pWidth = 150;
        pHeight = 100;
#endif
        custom = nullptr;
        standard = nullptr;
    }

    QVBoxLayout *rightLay = new QVBoxLayout;
    topLay->addLayout(rightLay);

    QHBoxLayout *pickLay = new QHBoxLayout;
    rightLay->addLayout(pickLay);

    QVBoxLayout *cLay = new QVBoxLayout;
    pickLay->addLayout(cLay);
    cp = new QColorPicker(q);

    cp->setFrameStyle(QFrame::Panel | QFrame::Sunken);

#if defined(QT_SMALL_COLORDIALOG)
    cp->hide();
#else
    cLay->addSpacing(lumSpace);
    cLay->addWidget(cp);
#endif
    cLay->addSpacing(lumSpace);

    lp = new QColorLuminancePicker(q);
#if defined(QT_SMALL_COLORDIALOG)
    lp->hide();
#else
    lp->setFixedWidth(20);
    pickLay->addSpacing(10);
    pickLay->addWidget(lp);
    pickLay->addStretch();
#endif

    QObject::connect(cp, &QColorPicker::newCol, lp, qOverload<int, int>(&QColorLuminancePicker::setCol));
    QObjectPrivate::connect(lp, &QColorLuminancePicker::newHsv, this, &QColorDialogPrivate::newHsv);

    rightLay->addStretch();

    cs = new QColorShower(q);
    pickLay->setContentsMargins(cs->gl->contentsMargins());
    QObjectPrivate::connect(cs, &QColorShower::newCol,
                            this, &QColorDialogPrivate::newColorTypedIn);
    QObject::connect(cs, &QColorShower::currentColorChanged,
                     q, &QColorDialog::currentColorChanged);
#if defined(QT_SMALL_COLORDIALOG)
    topLay->addWidget(cs);
#else
    rightLay->addWidget(cs);
    if (leftLay)
        leftLay->addSpacing(cs->gl->contentsMargins().right());
#endif

    buttons = new QDialogButtonBox(q);
    mainLay->addWidget(buttons);

    ok = buttons->addButton(QDialogButtonBox::Ok);
    QObject::connect(ok, &QPushButton::clicked, q, &QColorDialog::accept);
    ok->setDefault(true);
    cancel = buttons->addButton(QDialogButtonBox::Cancel);
    QObject::connect(cancel, &QPushButton::clicked, q, &QColorDialog::reject);

#ifdef Q_OS_WIN32
    updateTimer = new QTimer(q);
    QObjectPrivate::connect(updateTimer, &QTimer::timeout,
                            this, qOverload<>(&QColorDialogPrivate::updateColorPicking));
#endif
    retranslateStrings();
}